

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void Cmd_cmdlist(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *local_30;
  char *filter;
  int count;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = FCommandLine::operator[](argv,1);
  }
  iVar1 = ListActionCommands(local_30);
  iVar2 = DumpHash(Commands,false,local_30);
  Printf("%d commands\n",(ulong)(uint)(iVar2 + iVar1));
  return;
}

Assistant:

CCMD (cmdlist)
{
	int count;
	const char *filter = (argv.argc() == 1 ? NULL : argv[1]);

	count = ListActionCommands (filter);
	count += DumpHash (Commands, false, filter);
	Printf ("%d commands\n", count);
}